

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_deleted_doc_right_before_the_end_test(void)

{
  fdb_status fVar1;
  fdb_iterator **ptr_iterator;
  fdb_config *pfVar2;
  uint uVar3;
  int iVar4;
  int delete_opt;
  ulong uVar5;
  char *pcVar6;
  fdb_iterator *fit;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char keybuf [256];
  char cmd [256];
  char valuebuf [256];
  fdb_iterator *pfStack_c28;
  fdb_kvs_handle *pfStack_c20;
  fdb_file_handle *pfStack_c18;
  fdb_doc *pfStack_c10;
  fdb_kvs_config fStack_c08;
  timeval tStack_bf0;
  fdb_config fStack_be0;
  fdb_config *pfStack_ae8;
  fdb_iterator *pfStack_ad0;
  fdb_kvs_handle *pfStack_ac8;
  fdb_doc *pfStack_ac0;
  fdb_file_handle *pfStack_ab8;
  fdb_kvs_config fStack_ab0;
  timeval tStack_a98;
  fdb_config fStack_a88;
  fdb_config *pfStack_990;
  fdb_iterator *pfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_file_handle *pfStack_968;
  fdb_doc *pfStack_960;
  uint64_t uStack_958;
  undefined1 uStack_950;
  undefined7 uStack_948;
  undefined4 uStack_941;
  undefined8 uStack_938;
  undefined7 uStack_930;
  undefined4 uStack_929;
  fdb_kvs_config fStack_920;
  timeval tStack_908;
  undefined4 uStack_8f8;
  undefined1 uStack_8f4;
  fdb_config fStack_7f0;
  char acStack_6f8 [256];
  fdb_config *pfStack_5f8;
  char *pcStack_5f0;
  code *pcStack_5e8;
  fdb_doc *pfStack_5d0;
  fdb_iterator *pfStack_5c8;
  fdb_kvs_handle *pfStack_5c0;
  fdb_file_handle *pfStack_5b8;
  fdb_kvs_config fStack_5b0;
  timeval tStack_598;
  fdb_config fStack_588;
  fdb_iterator **ppfStack_490;
  fdb_iterator *local_478;
  fdb_doc *local_470;
  fdb_kvs_handle *local_468;
  fdb_file_handle *local_460;
  timeval local_458;
  fdb_iterator *local_448 [33];
  fdb_kvs_config local_340;
  char local_328 [264];
  fdb_config local_220;
  char local_128 [256];
  
  ppfStack_490 = (fdb_iterator **)0x11ba36;
  gettimeofday(&local_458,(__timezone_ptr_t)0x0);
  ppfStack_490 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_490 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  local_220.buffercache_size = 0;
  ppfStack_490 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_490 = (fdb_iterator **)0x11ba86;
  sprintf(local_328,"rm -rf  %s*","./dummy");
  ppfStack_490 = (fdb_iterator **)0x11ba8e;
  system(local_328);
  ppfStack_490 = (fdb_iterator **)0x11baa1;
  fdb_open(&local_460,"./dummy",&local_220);
  ppfStack_490 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(local_460,&local_468,(char *)0x0,&local_340);
  uVar5 = 0;
  do {
    ppfStack_490 = (fdb_iterator **)0x11bae0;
    sprintf((char *)local_448,"k%06d\n",uVar5);
    ppfStack_490 = (fdb_iterator **)0x11baef;
    sprintf(local_128,"v%06d\n",uVar5);
    ppfStack_490 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(local_468,local_448,8,local_128,8);
    uVar3 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar3;
  } while (uVar3 != 3);
  ppfStack_490 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)local_448,"k%06d\n",1);
  ppfStack_490 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(local_468,local_448,8);
  ppfStack_490 = (fdb_iterator **)0x11bb4a;
  fdb_commit(local_460,'\0');
  local_448[0]._0_2_ = 0x61;
  local_328[0] = 'z';
  local_328[1] = '\0';
  ppfStack_490 = (fdb_iterator **)0x11bb81;
  fVar1 = fdb_iterator_init(local_468,&local_478,local_448,1,local_328,1,2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    ppfStack_490 = (fdb_iterator **)0x11bb93;
    fVar1 = fdb_iterator_seek_to_max(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bbb1;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_490 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)local_448,"k%06d\n",2);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bdc6;
    ppfStack_490 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(local_470);
    ppfStack_490 = (fdb_iterator **)0x11bbf8;
    fVar1 = fdb_iterator_prev(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bc16;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_490 = (fdb_iterator **)0x11bc36;
    sprintf((char *)local_448,"k%06d\n",0);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bdda;
    ppfStack_490 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(local_470);
    ptr_iterator = &local_478;
    ppfStack_490 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(local_478);
    ppfStack_490 = (fdb_iterator **)0x11bc89;
    fVar1 = fdb_iterator_init(local_468,ptr_iterator,local_448,1,local_328,1,2);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_490 = (fdb_iterator **)0x11bc9b;
    fVar1 = fdb_iterator_seek_to_min(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bcb9;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ptr_iterator,"k%06d\n",0);
    if (*local_470->key != CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) goto LAB_0011bdf3;
    ppfStack_490 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(local_470);
    ppfStack_490 = (fdb_iterator **)0x11bcfd;
    fVar1 = fdb_iterator_next(local_478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    local_470 = (fdb_doc *)0x0;
    ppfStack_490 = (fdb_iterator **)0x11bd1b;
    fVar1 = fdb_iterator_get(local_478,&local_470);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ptr_iterator,"k%06d\n",2);
    if (*local_470->key == CONCAT62(local_448[0]._2_6_,local_448[0]._0_2_)) {
      ppfStack_490 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(local_470);
      ppfStack_490 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(local_478);
      ppfStack_490 = (fdb_iterator **)0x11bd6c;
      fdb_close(local_460);
      ppfStack_490 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_490 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      ppfStack_490 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar6,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_490 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_490 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_490 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_490 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_490 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_490 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ptr_iterator = local_448;
    ppfStack_490 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_490 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_490 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_490 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_490 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_490 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_490 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_490 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_5e8 = (code *)0x11be25;
  ppfStack_490 = ptr_iterator;
  gettimeofday(&tStack_598,(__timezone_ptr_t)0x0);
  pfStack_5d0 = (fdb_doc *)0x0;
  pcStack_5e8 = (code *)0x11be33;
  memleak_start();
  pfVar2 = &fStack_588;
  pcStack_5e8 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_5e8 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_5e8 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_5e8 = (code *)0x11be6a;
  fVar1 = fdb_open(&pfStack_5b8,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_5e8 = (code *)0x11be86;
    fVar1 = fdb_kvs_open_default(pfStack_5b8,&pfStack_5c0,&fStack_5b0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_5e8 = (code *)0x11bea9;
    fdb_set_kv(pfStack_5c0,"a",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x155b95;
    pcStack_5e8 = (code *)0x11bec7;
    fdb_set_kv(pfStack_5c0,"b",1,(void *)0x0,0);
    pcStack_5e8 = (code *)0x11bee2;
    fdb_set_kv(pfStack_5c0,"c",1,(void *)0x0,0);
    pcStack_5e8 = (code *)0x11bf06;
    fVar1 = fdb_iterator_init(pfStack_5c0,&pfStack_5c8,"b",1,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_5e8 = (code *)0x11bf18;
    fVar1 = fdb_iterator_seek_to_min(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_5e8 = (code *)0x11bf2f;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_5d0->key != 'b') goto LAB_0011c0ab;
    pcStack_5e8 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11bf61;
    fVar1 = fdb_iterator_seek_to_max(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_5e8 = (code *)0x11bf78;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_5d0->key != 'c') goto LAB_0011c0c1;
    pcStack_5e8 = (code *)0x11bf97;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11bfaa;
    fVar1 = fdb_iterator_prev(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_5e8 = (code *)0x11bfc1;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_5d0->key != 'b') goto LAB_0011c0d7;
    pcStack_5e8 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_5d0);
    pfStack_5d0 = (fdb_doc *)0x0;
    pcStack_5e8 = (code *)0x11bff3;
    fVar1 = fdb_iterator_next(pfStack_5c8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_5e8 = (code *)0x11c00a;
    fVar1 = fdb_iterator_get(pfStack_5c8,&pfStack_5d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_5d0->key == 'c') {
      pcStack_5e8 = (code *)0x11c029;
      fdb_doc_free(pfStack_5d0);
      pfStack_5d0 = (fdb_doc *)0x0;
      pcStack_5e8 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_5c8);
      pcStack_5e8 = (code *)0x11c046;
      fdb_close(pfStack_5b8);
      pcStack_5e8 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_5e8 = (code *)0x11c050;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pcStack_5e8 = (code *)0x11c081;
      fprintf(_stderr,pcVar6,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_5e8 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_5e8 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_5e8 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_5e8 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_5e8 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_5e8 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_5e8 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_5e8 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_5e8 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_5e8 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_5e8 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_5e8 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_5e8 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_5e8 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_5e8 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_990 = (fdb_config *)0x11c10f;
  pfStack_5f8 = pfVar2;
  pcStack_5f0 = (char *)local_448;
  pcStack_5e8 = (code *)uVar5;
  gettimeofday(&tStack_908,(__timezone_ptr_t)0x0);
  pfStack_990 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar2 = &fStack_7f0;
  pfStack_990 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_7f0.buffercache_size = 0;
  pfStack_990 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_990 = (fdb_config *)0x11c156;
  sprintf(acStack_6f8,"rm -rf  %s*","./iterator_test");
  pfStack_990 = (fdb_config *)0x11c15e;
  system(acStack_6f8);
  pfStack_990 = (fdb_config *)0x11c172;
  fVar1 = fdb_open(&pfStack_968,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_990 = (fdb_config *)0x11c190;
    fVar1 = fdb_kvs_open(pfStack_968,&pfStack_970,(char *)0x0,&fStack_920);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_930 = 0x34323634353773;
    uStack_929 = 0xff;
    uStack_948 = 0x34323634353773;
    uStack_941 = 0x10000ff;
    uStack_938._0_4_ = 0x34353773;
    uStack_938._4_1_ = true;
    uStack_938._5_1_ = true;
    uStack_938._6_1_ = '4';
    uStack_938._7_1_ = 0xff;
    uStack_958 = 0xff34323634353773;
    uStack_950 = 0xff;
    uStack_8f8 = 0x3179656b;
    uStack_8f4 = 0;
    pfStack_990 = (fdb_config *)0x11c1f4;
    fVar1 = fdb_set_kv(pfStack_970,&uStack_930,0xb,&uStack_8f8,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_8f4 = 0;
    uStack_8f8 = 0x3279656b;
    pfStack_990 = (fdb_config *)0x11c228;
    fVar1 = fdb_set_kv(pfStack_970,&uStack_948,0xb,&uStack_8f8,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_990 = (fdb_config *)0x11c23f;
    fVar1 = fdb_commit(pfStack_968,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_990 = (fdb_config *)0x11c272;
    fVar1 = fdb_iterator_init(pfStack_970,&pfStack_978,&uStack_938,8,&uStack_958,9,10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar4 = 0;
    pfVar2 = (fdb_config *)&pfStack_960;
    do {
      pfStack_960 = (fdb_doc *)0x0;
      pfStack_990 = (fdb_config *)0x11c297;
      fVar1 = fdb_iterator_get(pfStack_978,(fdb_doc **)pfVar2);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      iVar4 = iVar4 + 1;
      pfStack_990 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_960);
      pfStack_990 = (fdb_config *)0x11c2b1;
      fVar1 = fdb_iterator_next(pfStack_978);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    if (iVar4 != 2) goto LAB_0011c343;
    pfStack_990 = (fdb_config *)0x11c2c8;
    fVar1 = fdb_iterator_close(pfStack_978);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_990 = (fdb_config *)0x11c2d6;
    fVar1 = fdb_close(pfStack_968);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_990 = (fdb_config *)0x11c2df;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_990 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_990 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar6,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_990 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_990 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_990 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_990 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_990 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_990 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_990 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_990 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_990 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_990 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_ae8 = (fdb_config *)0x11c36d;
  pfStack_990 = pfVar2;
  gettimeofday(&tStack_a98,(__timezone_ptr_t)0x0);
  pfStack_ae8 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_ad0 = (fdb_iterator *)0x0;
  pfStack_ac0 = (fdb_doc *)0x0;
  pfVar2 = &fStack_a88;
  pfStack_ae8 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_ae8 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_ae8 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_ae8 = (fdb_config *)0x11c3b3;
  fVar1 = fdb_open(&pfStack_ab8,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_ae8 = (fdb_config *)0x11c3cf;
    fVar1 = fdb_kvs_open_default(pfStack_ab8,&pfStack_ac8,&fStack_ab0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_ae8 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_ac8,"A",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x155dcc;
    pfStack_ae8 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_ac8,"B",1,(void *)0x0,0);
    pfStack_ae8 = (fdb_config *)0x11c43b;
    fVar1 = fdb_iterator_init(pfStack_ac8,&pfStack_ad0,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_ae8 = (fdb_config *)0x11c44d;
    fVar1 = fdb_iterator_seek_to_max(pfStack_ad0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_ae8 = (fdb_config *)0x11c464;
    fVar1 = fdb_iterator_get(pfStack_ad0,&pfStack_ac0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_ac0->key != 'B') goto LAB_0011c5a6;
    pfStack_ae8 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_ac0);
    pfStack_ac0 = (fdb_doc *)0x0;
    pfStack_ae8 = (fdb_config *)0x11c496;
    fVar1 = fdb_iterator_close(pfStack_ad0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_ad0 = (fdb_iterator *)0x0;
    pfStack_ae8 = (fdb_config *)0x11c4bd;
    fVar1 = fdb_del_kv(pfStack_ac8,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_ae8 = (fdb_config *)0x11c4f4;
    fVar1 = fdb_iterator_init(pfStack_ac8,&pfStack_ad0,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_ae8 = (fdb_config *)0x11c50b;
    fVar1 = fdb_iterator_get(pfStack_ad0,&pfStack_ac0);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_ae8 = (fdb_config *)0x11c51e;
    fVar1 = fdb_iterator_seek_to_max(pfStack_ad0);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_ae8 = (fdb_config *)0x11c531;
    fVar1 = fdb_close(pfStack_ab8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_ae8 = (fdb_config *)0x11c53e;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_ae8 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_ae8 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar6,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_ae8 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_ae8 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_ae8 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_ae8 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_ae8 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_ae8 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_ae8 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_ae8 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_ae8 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_ae8 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_ae8 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_ae8 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_ae8 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_ae8 = pfVar2;
  gettimeofday(&tStack_bf0,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_c28 = (fdb_iterator *)0x0;
  pfStack_c10 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(&pfStack_c18,"./iterator_test1",&fStack_be0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(pfStack_c18,&pfStack_c20,&fStack_c08);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_c20,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_c20,"C",1,(void *)0x0,0);
    fVar1 = fdb_del_kv(pfStack_c20,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar1 = fdb_iterator_init(pfStack_c20,&pfStack_c28,"A",1,"B",1,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar1 = fdb_iterator_get(pfStack_c28,&pfStack_c10);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar1 = fdb_iterator_seek_to_min(pfStack_c28);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar1 = fdb_iterator_close(pfStack_c28);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar1 = fdb_close(pfStack_c18);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar6 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar6,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar4 = 0;
  do {
    delete_opt = 0;
    do {
      iterator_complete_test(iVar4,delete_opt);
      delete_opt = delete_opt + 1;
    } while (delete_opt == 1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_deleted_doc_right_before_the_end_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_doc *rdoc;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256], cmd[256];

    memleak_start();

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    sprintf(cmd, SHELL_DEL " %s*", "./dummy");
    r = system(cmd); (void)r;

    fdb_open(&dbfile, "./dummy", &config);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // insert 3 docs
    for (i=0;i<3;++i) {
        sprintf(keybuf, "k%06d\n", i);
        sprintf(valuebuf, "v%06d\n", i);
        fdb_set_kv(db, keybuf, 8, valuebuf, 8);
    }

    // delete the middle doc
    i = 1;
    sprintf(keybuf, "k%06d\n", i);
    fdb_del_kv(db, keybuf, 8);

    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    sprintf(keybuf, "a");
    sprintf(cmd, "z");
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_prev(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    // opposite case
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_min(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_next(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator deleted doc right before the end of iteration test");
}